

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsStructTypes4<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsStructTypes4<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *this_00;
  long lVar2;
  string example_struct;
  string shader_source;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,
             "struct light {\n    float[2] intensity;\n    int[2] position;\n} lightVar[2]","");
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  std::__cxx11::string::_M_assign((string *)&local_50);
  lVar2 = 1;
  do {
    std::__cxx11::string::append((char *)&local_50);
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  std::__cxx11::string::append((char *)&local_50);
  std::__cxx11::string::_M_append((char *)&local_50,shader_start_abi_cxx11_);
  puVar1 = &set_tesseation_abi_cxx11_;
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    break;
  case 1:
    std::__cxx11::string::append((char *)&local_50);
    break;
  case 3:
    puVar1 = &emit_quad_abi_cxx11_;
  case 4:
    std::__cxx11::string::_M_append((char *)&local_50,*puVar1);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x5ba);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)&local_50,shader_end_abi_cxx11_);
  (*(code *)(&DAT_01ac98f0 + *(int *)(&DAT_01ac98f0 + (ulong)tested_shader_type * 4)))();
  return;
}

Assistant:

void SizedDeclarationsStructTypes4<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct("struct light {\n"
							   "    float[2] intensity;\n"
							   "    int[2] position;\n"
							   "} lightVar[2]");
	std::string shader_source;

	for (size_t max_dimension_index = 1; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		shader_source = example_struct;

		for (size_t temp_dimension_index = 0; temp_dimension_index < max_dimension_index; temp_dimension_index++)
		{
			shader_source += "[2]";
		}
		shader_source += ";\n\n";
		shader_source += shader_start;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}